

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O3

void duckdb::TemplatedRadixScatter<unsigned_long>
               (UnifiedVectorFormat *vdata,SelectionVector *sel,idx_t add_count,
               data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,idx_t offset)

{
  data_ptr_t pdVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  data_ptr_t pdVar4;
  idx_t iVar5;
  undefined7 in_register_00000089;
  idx_t s;
  idx_t iVar6;
  ulong uVar7;
  long lVar8;
  
  pdVar1 = vdata->data;
  if ((int)CONCAT71(in_register_00000089,has_null) == 0) {
    if (add_count != 0) {
      iVar5 = 0;
      do {
        iVar6 = iVar5;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar6 = (idx_t)sel->sel_vector[iVar5];
        }
        psVar2 = vdata->sel->sel_vector;
        if (psVar2 != (sel_t *)0x0) {
          iVar6 = (idx_t)psVar2[iVar6];
        }
        uVar7 = *(ulong *)(pdVar1 + iVar6 * 8 + offset * 8);
        *(ulong *)key_locations[iVar5] =
             uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
             (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
             (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
        if (desc) {
          lVar8 = 0;
          do {
            key_locations[iVar5][lVar8] = ~key_locations[iVar5][lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 8);
        }
        key_locations[iVar5] = key_locations[iVar5] + 8;
        iVar5 = iVar5 + 1;
      } while (iVar5 != add_count);
    }
  }
  else if (add_count != 0) {
    iVar5 = 0;
    do {
      iVar6 = iVar5;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar6 = (idx_t)sel->sel_vector[iVar5];
      }
      psVar2 = vdata->sel->sel_vector;
      if (psVar2 != (sel_t *)0x0) {
        iVar6 = (idx_t)psVar2[iVar6];
      }
      uVar7 = iVar6 + offset;
      puVar3 = (vdata->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar3 == (unsigned_long *)0x0) || ((puVar3[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0)) {
        *key_locations[iVar5] = nulls_first;
        uVar7 = *(ulong *)(pdVar1 + uVar7 * 8);
        *(ulong *)(key_locations[iVar5] + 1) =
             uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
             (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
             (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
        if (desc) {
          lVar8 = 0;
          do {
            key_locations[iVar5][lVar8 + 1] = ~key_locations[iVar5][lVar8 + 1];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 8);
        }
      }
      else {
        *key_locations[iVar5] = !nulls_first;
        pdVar4 = key_locations[iVar5];
        pdVar4[1] = '\0';
        pdVar4[2] = '\0';
        pdVar4[3] = '\0';
        pdVar4[4] = '\0';
        pdVar4[5] = '\0';
        pdVar4[6] = '\0';
        pdVar4[7] = '\0';
        pdVar4[8] = '\0';
      }
      key_locations[iVar5] = key_locations[iVar5] + 9;
      iVar5 = iVar5 + 1;
    } while (iVar5 != add_count);
  }
  return;
}

Assistant:

void TemplatedRadixScatter(UnifiedVectorFormat &vdata, const SelectionVector &sel, idx_t add_count,
                           data_ptr_t *key_locations, const bool desc, const bool has_null, const bool nulls_first,
                           const idx_t offset) {
	auto source = UnifiedVectorFormat::GetData<T>(vdata);
	if (has_null) {
		auto &validity = vdata.validity;
		const data_t valid = nulls_first ? 1 : 0;
		const data_t invalid = 1 - valid;

		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write validity and according value
			if (validity.RowIsValid(source_idx)) {
				key_locations[i][0] = valid;
				Radix::EncodeData<T>(key_locations[i] + 1, source[source_idx]);
				// invert bits if desc
				if (desc) {
					for (idx_t s = 1; s < sizeof(T) + 1; s++) {
						*(key_locations[i] + s) = ~*(key_locations[i] + s);
					}
				}
			} else {
				key_locations[i][0] = invalid;
				memset(key_locations[i] + 1, '\0', sizeof(T));
			}
			key_locations[i] += sizeof(T) + 1;
		}
	} else {
		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write value
			Radix::EncodeData<T>(key_locations[i], source[source_idx]);
			// invert bits if desc
			if (desc) {
				for (idx_t s = 0; s < sizeof(T); s++) {
					*(key_locations[i] + s) = ~*(key_locations[i] + s);
				}
			}
			key_locations[i] += sizeof(T);
		}
	}
}